

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalize_func.c
# Opt level: O2

void xc_deorbitalize_func_work
               (long func,long np,long rho,long sigma,long lapl,undefined8 param_6,double *zk,
               double *vrho,double *vsigma,double *vlapl,undefined8 vtau,double *v2rho2,
               double *v2rhosigma,double *v2rholapl,undefined8 v2rhotau,double *v2sigma2,
               double *v2sigmalapl,undefined8 v2sigmatau,double *v2lapl2,undefined8 v2lapltau,
               undefined8 v2tau2,long v3rho3)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  long *plVar3;
  long *plVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  uint uVar9;
  int iVar10;
  size_t __size;
  long lVar11;
  bool bVar12;
  bool bVar13;
  long v4rho4;
  double *ked1_vlapl;
  double *ked1_vsigma;
  double *ked1_vrho;
  double *ked2_vlapl;
  double *ked2_vsigma;
  double *ked2_vrho;
  double *ked1_v2lapl2;
  double *ked1_v2sigmalapl;
  double *ked1_v2sigma2;
  double *ked1_v2rholapl;
  double *ked1_v2rhosigma;
  double *ked1_v2rho2;
  double *ked2_v2lapl2;
  double *ked2_v2sigmalapl;
  double *ked2_v2sigma2;
  double *ked2_v2rholapl;
  double *ked2_v2rhosigma;
  double *ked2_v2rho2;
  double *ked1_v2tau2;
  double *ked1_v2lapltau;
  double *ked1_v2sigmatau;
  double *ked1_v2rhotau;
  double *ked1_vtau;
  double *ked1_zk;
  double *mgga_v2tau2;
  double *mgga_v2lapltau;
  double *mgga_v2lapl2;
  double *mgga_v2sigmatau;
  double *mgga_v2sigmalapl;
  double *mgga_v2sigma2;
  double *mgga_v2rhotau;
  double *mgga_v2rholapl;
  double *mgga_v2rhosigma;
  double *mgga_v2rho2;
  double *mgga_vtau;
  double *ked2_v2tau2;
  double *ked2_v2lapltau;
  double *ked2_v2sigmatau;
  double *ked2_v2rhotau;
  double *ked2_vtau;
  double *ked2_zk;
  double *mgga_vlapl;
  double *mgga_vsigma;
  double *mgga_vrho;
  double *mgga_zk;
  void *local_5a0;
  void *local_598;
  void *local_590;
  double *ked1_v4tau4;
  double *ked1_v4lapltau3;
  double *ked1_v4lapl2tau2;
  double *ked1_v4lapl3tau;
  double *ked1_v4lapl4;
  double *ked1_v4sigmatau3;
  double *ked1_v4sigmalapltau2;
  double *ked1_v4sigmalapl2tau;
  double *ked1_v4sigmalapl3;
  double *ked1_v4sigma2tau2;
  double *ked1_v4sigma2lapltau;
  double *ked1_v4sigma2lapl2;
  double *ked1_v4sigma3tau;
  double *ked1_v4sigma3lapl;
  double *ked1_v4sigma4;
  double *ked1_v4rhotau3;
  double *ked1_v4rholapltau2;
  double *ked1_v4rholapl2tau;
  double *ked1_v4rholapl3;
  double *ked1_v4rhosigmatau2;
  double *ked1_v4rhosigmalapltau;
  double *ked1_v4rhosigmalapl2;
  double *ked1_v4rhosigma2tau;
  double *ked1_v4rhosigma2lapl;
  double *ked1_v4rhosigma3;
  double *ked1_v4rho2tau2;
  double *ked1_v4rho2lapltau;
  double *ked1_v4rho2lapl2;
  double *ked1_v4rho2sigmatau;
  double *ked1_v4rho2sigmalapl;
  double *ked1_v4rho2sigma2;
  double *ked1_v4rho3tau;
  double *ked1_v4rho3lapl;
  double *ked1_v4rho3sigma;
  double *ked1_v4rho4;
  double *ked1_v3tau3;
  double *ked1_v3lapltau2;
  double *ked1_v3lapl2tau;
  double *ked1_v3lapl3;
  double *ked1_v3sigmatau2;
  double *ked1_v3sigmalapltau;
  double *ked1_v3sigmalapl2;
  double *ked1_v3sigma2tau;
  double *ked1_v3sigma2lapl;
  double *ked1_v3sigma3;
  double *ked1_v3rhotau2;
  double *ked1_v3rholapltau;
  double *ked1_v3rholapl2;
  double *ked1_v3rhosigmatau;
  double *ked1_v3rhosigmalapl;
  double *ked1_v3rhosigma2;
  double *ked1_v3rho2tau;
  double *ked1_v3rho2lapl;
  double *ked1_v3rho2sigma;
  double *ked1_v3rho3;
  void *local_3d0;
  double *mgga_v4tau4;
  double *mgga_v4lapltau3;
  double *mgga_v4lapl2tau2;
  double *mgga_v4lapl3tau;
  double *mgga_v4lapl4;
  double *mgga_v4sigmatau3;
  double *mgga_v4sigmalapltau2;
  double *mgga_v4sigmalapl2tau;
  double *mgga_v4sigmalapl3;
  double *mgga_v4sigma2tau2;
  double *mgga_v4sigma2lapltau;
  double *mgga_v4sigma2lapl2;
  double *mgga_v4sigma3tau;
  double *mgga_v4sigma3lapl;
  double *mgga_v4sigma4;
  double *mgga_v4rhotau3;
  double *mgga_v4rholapltau2;
  double *mgga_v4rholapl2tau;
  double *mgga_v4rholapl3;
  double *mgga_v4rhosigmatau2;
  double *mgga_v4rhosigmalapltau;
  double *mgga_v4rhosigmalapl2;
  double *mgga_v4rhosigma2tau;
  double *mgga_v4rhosigma2lapl;
  double *mgga_v4rhosigma3;
  double *mgga_v4rho2tau2;
  double *mgga_v4rho2lapltau;
  double *mgga_v4rho2lapl2;
  double *mgga_v4rho2sigmatau;
  double *mgga_v4rho2sigmalapl;
  double *mgga_v4rho2sigma2;
  double *mgga_v4rho3tau;
  double *mgga_v4rho3lapl;
  double *mgga_v4rho3sigma;
  double *mgga_v4rho4;
  double *mgga_v3tau3;
  double *mgga_v3lapltau2;
  double *mgga_v3lapl2tau;
  double *mgga_v3lapl3;
  double *mgga_v3sigmatau2;
  double *mgga_v3sigmalapltau;
  double *mgga_v3sigmalapl2;
  double *mgga_v3sigma2tau;
  double *mgga_v3sigma2lapl;
  double *mgga_v3sigma3;
  double *mgga_v3rhotau2;
  double *mgga_v3rholapltau;
  double *mgga_v3rholapl2;
  double *mgga_v3rhosigmatau;
  double *mgga_v3rhosigmalapl;
  double *mgga_v3rhosigma2;
  double *mgga_v3rho2tau;
  double *mgga_v3rho2lapl;
  double *mgga_v3rho2sigma;
  double *mgga_v3rho3;
  double *ked2_v4tau4;
  double *ked2_v4lapltau3;
  double *ked2_v4lapl2tau2;
  double *ked2_v4lapl3tau;
  double *ked2_v4lapl4;
  double *ked2_v4sigmatau3;
  double *ked2_v4sigmalapltau2;
  double *ked2_v4sigmalapl2tau;
  double *ked2_v4sigmalapl3;
  double *ked2_v4sigma2tau2;
  double *ked2_v4sigma2lapltau;
  double *ked2_v4sigma2lapl2;
  double *ked2_v4sigma3tau;
  double *ked2_v4sigma3lapl;
  double *ked2_v4sigma4;
  double *ked2_v4rhotau3;
  double *ked2_v4rholapltau2;
  double *ked2_v4rholapl2tau;
  double *ked2_v4rholapl3;
  double *ked2_v4rhosigmatau2;
  double *ked2_v4rhosigmalapltau;
  double *ked2_v4rhosigmalapl2;
  double *ked2_v4rhosigma2tau;
  double *ked2_v4rhosigma2lapl;
  double *ked2_v4rhosigma3;
  double *ked2_v4rho2tau2;
  double *ked2_v4rho2lapltau;
  double *ked2_v4rho2lapl2;
  double *ked2_v4rho2sigmatau;
  double *ked2_v4rho2sigmalapl;
  double *ked2_v4rho2sigma2;
  double *ked2_v4rho3tau;
  double *ked2_v4rho3lapl;
  double *ked2_v4rho3sigma;
  double *ked2_v4rho4;
  double *ked2_v3tau3;
  double *ked2_v3lapltau2;
  double *ked2_v3lapl2tau;
  double *ked2_v3lapl3;
  double *ked2_v3sigmatau2;
  double *ked2_v3sigmalapltau;
  double *ked2_v3sigmalapl2;
  double *ked2_v3sigma2tau;
  double *ked2_v3sigma2lapl;
  double *ked2_v3sigma3;
  double *ked2_v3rhotau2;
  double *ked2_v3rholapltau;
  double *ked2_v3rholapl2;
  double *ked2_v3rhosigmatau;
  double *ked2_v3rhosigmalapl;
  double *ked2_v3rhosigma2;
  double *ked2_v3rho2tau;
  double *ked2_v3rho2lapl;
  double *ked2_v3rho2sigma;
  double *ked2_v3rho3;
  double *null;
  undefined8 local_48;
  double *local_40;
  undefined8 local_38;
  
  null = (double *)0x0;
  uVar9 = 1;
  if (vrho == (double *)0x0) {
    uVar9 = -(uint)(zk == (double *)0x0);
  }
  uVar5 = 2;
  if (v2rho2 == (double *)0x0) {
    uVar5 = uVar9;
  }
  uVar9 = 3;
  if (v3rho3 == 0) {
    uVar9 = uVar5;
  }
  uVar5 = 4;
  if (v4rho4 == 0) {
    uVar5 = uVar9;
  }
  if (-1 < (int)uVar5) {
    plVar3 = *(long **)(func + 0x10);
    plVar4 = (long *)*plVar3;
    bVar13 = uVar5 != 0;
    bVar12 = 1 < uVar5;
    xc_mgga_vars_allocate_all(*(undefined4 *)(*plVar4 + 0x10),np,plVar4 + 9,1,bVar13,bVar12);
    plVar3 = (long *)plVar3[1];
    uVar2 = *(undefined4 *)(*plVar3 + 0x10);
    xc_mgga_vars_allocate_all(uVar2,np,plVar3 + 9,1,bVar13,bVar12);
    if (*(int *)(func + 8) == 1) {
      local_590 = malloc(np * 8);
      xc_mgga_evaluate_functional(plVar3,np,rho,sigma,lapl,0);
    }
    else {
      __size = np << 4;
      local_598 = malloc(__size);
      local_5a0 = malloc(np * 0x18);
      local_3d0 = malloc(__size);
      local_590 = malloc(__size);
      xc_mgga_vars_allocate_all(uVar2,np,plVar3 + 9,1,bVar13,bVar12);
      lVar6 = 0;
      lVar11 = 0;
      lVar7 = np;
      while (bVar12 = lVar7 != 0, lVar7 = lVar7 + -1, bVar12) {
        *(undefined8 *)((long)local_598 + lVar11) = *(undefined8 *)(rho + lVar11);
        *(undefined8 *)((long)local_598 + lVar11 + 8) = 0;
        *(undefined8 *)((long)local_5a0 + lVar6) = *(undefined8 *)(sigma + lVar6);
        puVar1 = (undefined8 *)((long)local_5a0 + lVar6 + 8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)local_3d0 + lVar11) = *(undefined8 *)(lapl + lVar11);
        *(undefined8 *)((long)local_3d0 + lVar11 + 8) = 0;
        lVar11 = lVar11 + 0x10;
        lVar6 = lVar6 + 0x18;
      }
      lVar11 = 0;
      xc_mgga_evaluate_functional(plVar3,np,local_598,local_5a0,local_3d0,0);
      lVar6 = 0;
      lVar7 = np;
      while (bVar12 = lVar7 != 0, lVar7 = lVar7 + -1, bVar12) {
        *(undefined8 *)((long)local_598 + lVar6) = *(undefined8 *)(rho + 8 + lVar6);
        *(undefined8 *)((long)local_5a0 + lVar11) = *(undefined8 *)(sigma + 0x10 + lVar11);
        *(undefined8 *)((long)local_3d0 + lVar6) = *(undefined8 *)(lapl + 8 + lVar6);
        lVar6 = lVar6 + 0x10;
        lVar11 = lVar11 + 0x18;
      }
      xc_mgga_evaluate_functional
                (*(undefined8 *)(*(long *)(func + 0x10) + 8),np,local_598,local_5a0,local_3d0,0);
    }
    if (*(int *)(func + 8) == 1) {
      for (lVar7 = 0; np != lVar7; lVar7 = lVar7 + 1) {
        *(double *)((long)local_590 + lVar7 * 8) =
             *(double *)(rho + lVar7 * 8) * *(double *)(lVar7 * 8);
      }
    }
    else {
      pdVar8 = (double *)0x0;
      lVar7 = np;
      while (bVar12 = lVar7 != 0, lVar7 = lVar7 + -1, bVar12) {
        *(double *)((long)local_590 + (long)pdVar8 * 2) =
             *(double *)(rho + (long)pdVar8 * 2) * *pdVar8;
        *(double *)((long)local_590 + (long)pdVar8 * 2 + 8) =
             *(double *)(rho + 8 + (long)pdVar8 * 2) * *pdVar8;
        pdVar8 = pdVar8 + 1;
      }
    }
    xc_mgga_evaluate_functional(**(undefined8 **)(func + 0x10),np,rho,sigma,lapl);
    lVar7 = np;
    while( true ) {
      bVar12 = lVar7 == 0;
      lVar7 = lVar7 + -1;
      if (bVar12) break;
      if (zk != (double *)0x0) {
        *zk = dRam0000000000000000;
      }
      if (vrho != (double *)0x0) {
        *vrho = dRam0000000000000000 * dRam0000000000000000 + dRam0000000000000000;
        *vsigma = dRam0000000000000000 * dRam0000000000000000 + dRam0000000000000000;
        *vlapl = dRam0000000000000000 * dRam0000000000000000 + dRam0000000000000000;
        if (*(int *)(func + 8) == 2) {
          vrho[1] = dRam0000000000000000 * dRam0000000000000008 + dRam0000000000000008;
          vsigma[1] = dRam0000000000000008;
          vsigma[2] = dRam0000000000000000 * dRam0000000000000008 + dRam0000000000000010;
          vlapl[1] = dRam0000000000000000 * dRam0000000000000008 + dRam0000000000000008;
        }
      }
      if (v2rho2 != (double *)0x0) {
        *v2rho2 = (dRam0000000000000000 + dRam0000000000000000) * dRam0000000000000000 +
                  dRam0000000000000000 * dRam0000000000000000 +
                  dRam0000000000000000 * dRam0000000000000000 * dRam0000000000000000 +
                  dRam0000000000000000;
        *v2rhosigma = (dRam0000000000000000 * dRam0000000000000000 + dRam0000000000000000) *
                      dRam0000000000000000 +
                      dRam0000000000000000 * dRam0000000000000000 +
                      dRam0000000000000000 * dRam0000000000000000 + dRam0000000000000000;
        local_38 = 0;
        local_40 = v2rholapl;
        *v2rholapl = (dRam0000000000000000 * dRam0000000000000000 + dRam0000000000000000) *
                     dRam0000000000000000 +
                     dRam0000000000000000 * dRam0000000000000000 +
                     dRam0000000000000000 * dRam0000000000000000 + dRam0000000000000000;
        *v2sigma2 = (dRam0000000000000000 + dRam0000000000000000) * dRam0000000000000000 +
                    dRam0000000000000000 * dRam0000000000000000 +
                    dRam0000000000000000 * dRam0000000000000000 * dRam0000000000000000 +
                    dRam0000000000000000;
        *v2sigmalapl = (dRam0000000000000000 * dRam0000000000000000 + dRam0000000000000000) *
                       dRam0000000000000000 +
                       dRam0000000000000000 * dRam0000000000000000 +
                       dRam0000000000000000 * dRam0000000000000000 + dRam0000000000000000;
        *v2lapl2 = (dRam0000000000000000 + dRam0000000000000000) * dRam0000000000000000 +
                   dRam0000000000000000 * dRam0000000000000000 +
                   dRam0000000000000000 * dRam0000000000000000 * dRam0000000000000000 +
                   dRam0000000000000000;
        if (*(int *)(func + 8) == 2) {
          v2rho2[1] = (dRam0000000000000008 * dRam0000000000000000 + dRam0000000000000010) *
                      dRam0000000000000000 + dRam0000000000000000 * dRam0000000000000008 +
                      dRam0000000000000008;
          local_48 = 0;
          v2rho2[2] = (dRam0000000000000000 + dRam0000000000000000) * dRam0000000000000018 +
                      dRam0000000000000000 * dRam0000000000000008 +
                      dRam0000000000000000 * dRam0000000000000000 * dRam0000000000000010 +
                      dRam0000000000000010;
          v2rhosigma[1] = dRam0000000000000000 * dRam0000000000000010 + dRam0000000000000008;
          v2rhosigma[2] =
               dRam0000000000000000 * dRam0000000000000020 +
               (dRam0000000000000008 * dRam0000000000000000 + dRam0000000000000008) *
               dRam0000000000000000 + dRam0000000000000010;
          v2rhosigma[3] =
               dRam0000000000000000 * dRam0000000000000008 +
               (dRam0000000000000008 * dRam0000000000000000 + dRam0000000000000010) *
               dRam0000000000000000 + dRam0000000000000018;
          v2rhosigma[4] = dRam0000000000000000 * dRam0000000000000018 + dRam0000000000000020;
          v2rhosigma[5] =
               (dRam0000000000000000 * dRam0000000000000010 + dRam0000000000000018) *
               dRam0000000000000000 +
               dRam0000000000000000 * dRam0000000000000008 + _DAT_00000028 * dRam0000000000000000 +
               _DAT_00000028;
          v2rholapl[1] = dRam0000000000000000 * dRam0000000000000010 +
                         (dRam0000000000000008 * dRam0000000000000000 + dRam0000000000000008) *
                         dRam0000000000000000 + dRam0000000000000008;
          v2rholapl[2] = dRam0000000000000000 * dRam0000000000000008 +
                         (dRam0000000000000008 * dRam0000000000000000 + dRam0000000000000010) *
                         dRam0000000000000000 + dRam0000000000000010;
          v2rholapl[3] = (dRam0000000000000000 * dRam0000000000000010 + dRam0000000000000018) *
                         dRam0000000000000000 +
                         dRam0000000000000000 * dRam0000000000000008 +
                         dRam0000000000000018 * dRam0000000000000000 + dRam0000000000000018;
          v2sigma2[1] = dRam0000000000000000 * dRam0000000000000010 + dRam0000000000000008;
          v2sigma2[2] = (dRam0000000000000008 * dRam0000000000000000 + dRam0000000000000020) *
                        dRam0000000000000000 + dRam0000000000000000 * dRam0000000000000008 +
                        dRam0000000000000010;
          v2sigma2[3] = dRam0000000000000018;
          v2sigma2[4] = dRam0000000000000000 * dRam0000000000000018 + dRam0000000000000020;
          v2sigma2[5] = (dRam0000000000000000 + dRam0000000000000000) * _DAT_00000028 +
                        dRam0000000000000000 * dRam0000000000000008 +
                        dRam0000000000000000 * dRam0000000000000000 * dRam0000000000000010 +
                        _DAT_00000028;
          v2sigmalapl[1] =
               dRam0000000000000000 * dRam0000000000000010 +
               (dRam0000000000000008 * dRam0000000000000000 + dRam0000000000000008) *
               dRam0000000000000000 + dRam0000000000000008;
          v2sigmalapl[2] = dRam0000000000000000 * dRam0000000000000010 + dRam0000000000000010;
          v2sigmalapl[3] = dRam0000000000000000 * dRam0000000000000018 + dRam0000000000000018;
          v2sigmalapl[4] =
               dRam0000000000000000 * dRam0000000000000008 +
               (dRam0000000000000008 * dRam0000000000000000 + dRam0000000000000020) *
               dRam0000000000000000 + dRam0000000000000020;
          v2sigmalapl[5] =
               (dRam0000000000000000 * dRam0000000000000010 + _DAT_00000028) * dRam0000000000000000
               + dRam0000000000000000 * dRam0000000000000008 +
                 dRam0000000000000018 * dRam0000000000000000 + _DAT_00000028;
          v2lapl2[1] = (dRam0000000000000008 * dRam0000000000000000 + dRam0000000000000010) *
                       dRam0000000000000000 + dRam0000000000000000 * dRam0000000000000008 +
                       dRam0000000000000008;
          v2lapl2[2] = (dRam0000000000000000 + dRam0000000000000000) * dRam0000000000000018 +
                       dRam0000000000000000 * dRam0000000000000008 +
                       dRam0000000000000000 * dRam0000000000000000 * dRam0000000000000010 +
                       dRam0000000000000010;
        }
      }
      internal_counters_mgga_next(func + 0x48,0,&null,&null,&null,&null);
      internal_counters_mgga_next(**(long **)(func + 0x10) + 0x48,0,&null,&null,&null,&null);
      internal_counters_mgga_next
                (*(long *)(*(long *)(func + 0x10) + 8) + 0x48,0,&null,&null,&null,&null);
      if (*(int *)(func + 8) == 2) {
        internal_counters_mgga_next
                  (*(long *)(*(long *)(func + 0x10) + 8) + 0x48,0,&null,&null,&null,&null);
      }
    }
    iVar10 = -(int)np;
    internal_counters_mgga_random(**(long **)(func + 0x10) + 0x48,iVar10,0,&null,&null,&null);
    xc_mgga_vars_free_all(0,0,0,0,0,0);
    internal_counters_mgga_random
              (*(long *)(*(long *)(func + 0x10) + 8) + 0x48,iVar10,0,&null,&null,&null);
    xc_mgga_vars_free_all(0,0,0,0,0,0);
    if (*(int *)(func + 8) == 2) {
      internal_counters_mgga_random
                (*(long *)(*(long *)(func + 0x10) + 8) + 0x48,iVar10,0,&null,&null,&null);
      xc_mgga_vars_free_all(0,0,0,0,0,0);
      free(local_598);
      free(local_5a0);
      free(local_3d0);
    }
    free(local_590);
  }
  return;
}

Assistant:

void
xc_deorbitalize_func_work(const xc_func_type *func, size_t np,
                     const double *rho, const double *sigma, const double *lapl, const double *tau,
                     double *zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA double *, ))
{
  double *mrho, *msigma, *mlapl, *mtau;
  const double *null = NULL;
  double *mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA *, mgga_);
  double *ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA *, ked1_);
  double *ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA *, ked2_);
  size_t ii;
  int order = -1;

  if(zk     != NULL) order = 0;
  if(vrho   != NULL) order = 1;
  if(v2rho2 != NULL) order = 2;
  if(v3rho3 != NULL) order = 3;
  if(v4rho4 != NULL) order = 4;

  if(order < 0) return;

  /* prepare buffers that will hold the results from the individual functionals */
  mgga_zk MGGA_OUT_PARAMS_NO_EXC(=, mgga_ ) = NULL;
  ked1_zk MGGA_OUT_PARAMS_NO_EXC(=, ked1_ ) = NULL;
  ked2_zk MGGA_OUT_PARAMS_NO_EXC(=, ked2_ ) = NULL;

  /* allocate buffers */
  xc_mgga_vars_allocate_all(func->func_aux[0]->info->family, np, &(func->func_aux[0]->dim),
                       order >= 0, order >= 1, order >= 2, order >= 3, order >= 4,
                       &mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, mgga_));
  xc_mgga_vars_allocate_all(func->func_aux[1]->info->family, np, &(func->func_aux[1]->dim),
                       order >= 0, order >= 1, order >= 2, order >= 3, order >= 4,
                       &ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked1_));

  if(func->nspin == XC_UNPOLARIZED){
    mtau   = (double *) libxc_malloc(sizeof(double)*np);
  }else{
    mrho   = (double *) libxc_malloc(2*sizeof(double)*np);
    msigma = (double *) libxc_malloc(3*sizeof(double)*np);
    mlapl  = (double *) libxc_malloc(2*sizeof(double)*np);
    mtau   = (double *) libxc_malloc(2*sizeof(double)*np);

    xc_mgga_vars_allocate_all(func->func_aux[1]->info->family, np, &(func->func_aux[1]->dim),
                         order >= 0, order >= 1, order >= 2, order >= 3, order >= 4,
                         &ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked2_));
  }

  /* evaluate the kinetic energy functional */
  if(func->nspin == XC_UNPOLARIZED){
    xc_mgga_evaluate_functional(func->func_aux[1], np, rho, sigma, lapl, NULL,
                           ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked1_));
  }else{
    for(ii=0; ii<np; ii++){
      mrho  [2*ii] = rho  [2*ii]; mrho  [2*ii+1] = 0.0;
      msigma[3*ii] = sigma[3*ii]; msigma[3*ii+1] = 0.0; msigma[3*ii+2] = 0.0;
      mlapl [2*ii] = lapl [2*ii]; mlapl [2*ii+1] = 0.0;
    }
    xc_mgga_evaluate_functional(func->func_aux[1], np, mrho, msigma, mlapl, NULL,
                           ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked1_));

    for(ii=0; ii<np; ii++){
      mrho  [2*ii] = rho  [2*ii + 1];
      msigma[3*ii] = sigma[3*ii + 2];
      mlapl [2*ii] = lapl [2*ii + 1];
    }
    xc_mgga_evaluate_functional(func->func_aux[1], np, mrho, msigma, mlapl, NULL,
                           ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked2_));

  }

  /* now evaluate the mgga functional */
  if(func->nspin == XC_UNPOLARIZED){
    for(ii=0; ii<np; ii++){
      mtau[ii] = rho[ii]*ked1_zk[ii];
    }
  }else{
    for(ii=0; ii<np; ii++){
      mtau[2*ii    ] = rho[2*ii    ]*ked1_zk[ii];
      mtau[2*ii + 1] = rho[2*ii + 1]*ked2_zk[ii];
    }
  }
  xc_mgga_evaluate_functional(func->func_aux[0], np, rho, sigma, lapl, mtau,
                         mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, mgga_));

  /* now we have to combine the results */
  for(ii=0; ii<np; ii++){
    if(zk != NULL){
      *zk = *mgga_zk;
    }

#ifndef XC_DONT_COMPILE_VXC
    if(vrho != NULL){
#include "maple2c/deorbitalize_1.c"
    }
#ifndef XC_DONT_COMPILE_FXC
    if(v2rho2 != NULL){
#include "maple2c/deorbitalize_2.c"
    }
#ifndef XC_DONT_COMPILE_KXC
    if(v3rho3 != NULL){
#include "maple2c/deorbitalize_3.c"
    }
#ifndef XC_DONT_COMPILE_LXC
    if(v4rho4 != NULL){
#include "maple2c/deorbitalize_4.c"
    }
#endif
#endif
#endif
#endif

    internal_counters_mgga_next(&(func->dim), 0, &null, &null, &null, &null,
                                &zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ));
    internal_counters_mgga_next(&(func->func_aux[0]->dim), 0, &null, &null, &null, &null,
                                &mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, mgga_));
    internal_counters_mgga_next(&(func->func_aux[1]->dim), 0, &null, &null, &null, &null,
                                &ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked1_));
    if(func->nspin == XC_POLARIZED){
      internal_counters_mgga_next(&(func->func_aux[1]->dim), 0, &null, &null, &null, &null,
                                  &ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked2_));
    }
  }

  /* move the counters back to zero and deallocate the memory */
  internal_counters_mgga_random(&(func->func_aux[0]->dim), -np, 0, &null, &null, &null, &null,
                                &mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, mgga_));
  xc_mgga_vars_free_all(mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, mgga_));

  internal_counters_mgga_random(&(func->func_aux[1]->dim), -np, 0, &null, &null, &null, &null,
                                &ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked1_));
  xc_mgga_vars_free_all(ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked1_));
  if(func->nspin == XC_POLARIZED){
    internal_counters_mgga_random(&(func->func_aux[1]->dim), -np, 0, &null, &null, &null, &null,
                                  &ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked2_));
    xc_mgga_vars_free_all(ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked2_));

    free(mrho); free(msigma); free(mlapl);
  }
  free(mtau);
}